

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateFrameworkMethods
          (MessageGenerator *this,Printer *printer)

{
  ushort *puVar1;
  FieldGeneratorBase *pFVar2;
  Descriptor *pDVar3;
  Nonnull<const_char_*> pcVar4;
  csharp *pcVar5;
  undefined1 in_R9B;
  long lVar6;
  long lVar7;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view input;
  string_view input_00;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_90;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_70;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  puVar1 = (ushort *)(this->descriptor_->all_names_).payload_;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>(&local_70,&local_58,(char (*) [11])0x133b59e);
  std::__cxx11::string::operator=
            ((string *)((long)local_70.first.field_1.slot_ + 0x10),(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_08._M_str =
       "public override bool Equals(object other) {\n  return Equals(other as $class_name$);\n}\n\n"
  ;
  text_08._M_len = 0x57;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_58,text_08);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_09._M_str =
       "public bool Equals($class_name$ other) {\n  if (ReferenceEquals(other, null)) {\n    return false;\n  }\n  if (ReferenceEquals(other, this)) {\n    return true;\n  }\n"
  ;
  text_09._M_len = 0xa0;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_58,text_09);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pDVar3 = this->descriptor_;
  if (0 < pDVar3->field_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pFVar2 = CreateFieldGeneratorInternal
                         (this,(FieldDescriptor *)(&pDVar3->fields_->super_SymbolBase + lVar6));
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xe])(pFVar2,printer);
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar2);
      lVar7 = lVar7 + 1;
      pDVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x58;
    } while (lVar7 < pDVar3->field_count_);
  }
  pDVar3 = this->descriptor_;
  if (0 < pDVar3->real_oneof_decl_count_) {
    lVar6 = 8;
    lVar7 = 0;
    do {
      if (lVar7 < pDVar3->oneof_decl_count_) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar7,(long)pDVar3->oneof_decl_count_,"index < oneof_decl_count()");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa89,pcVar4);
        goto LAB_00e8f29b;
      }
      puVar1 = *(ushort **)(&pDVar3->oneof_decls_->super_SymbolBase + lVar6);
      pcVar5 = (csharp *)(ulong)*puVar1;
      input._M_len = ~(ulong)pcVar5 + (long)puVar1;
      input._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_(&local_90,pcVar5,input,false,(bool)in_R9B);
      text._M_str = "if ($property_name$Case != other.$property_name$Case) return false;\n";
      text._M_len = 0x44;
      io::Printer::Print<char[14],std::__cxx11::string>
                (printer,text,(char (*) [14])0x136e422,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
      pDVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x38;
    } while (lVar7 < pDVar3->real_oneof_decl_count_);
  }
  if (this->has_extension_ranges_ != false) {
    text_00._M_str = "if (!Equals(_extensions, other._extensions)) {\n  return false;\n}\n";
    text_00._M_len = 0x41;
    io::Printer::Print<>(printer,text_00);
  }
  io::Printer::Outdent(printer);
  text_01._M_str = "  return Equals(_unknownFields, other._unknownFields);\n}\n\n";
  text_01._M_len = 0x3a;
  io::Printer::Print<>(printer,text_01);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_02._M_str = "public override int GetHashCode() {\n  int hash = 1;\n";
  text_02._M_len = 0x34;
  io::Printer::Print<>(printer,text_02);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pDVar3 = this->descriptor_;
  if (0 < pDVar3->field_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pFVar2 = CreateFieldGeneratorInternal
                         (this,(FieldDescriptor *)(&pDVar3->fields_->super_SymbolBase + lVar6));
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xd])(pFVar2,printer);
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar2);
      lVar7 = lVar7 + 1;
      pDVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x58;
    } while (lVar7 < pDVar3->field_count_);
  }
  pDVar3 = this->descriptor_;
  if (0 < pDVar3->real_oneof_decl_count_) {
    lVar6 = 8;
    lVar7 = 0;
    do {
      if (lVar7 < pDVar3->oneof_decl_count_) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar7,(long)pDVar3->oneof_decl_count_,"index < oneof_decl_count()");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa89,pcVar4);
LAB_00e8f29b:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_70);
      }
      puVar1 = *(ushort **)(&pDVar3->oneof_decls_->super_SymbolBase + lVar6);
      pcVar5 = (csharp *)(ulong)*puVar1;
      input_00._M_len = ~(ulong)pcVar5 + (long)puVar1;
      input_00._M_str = (char *)0x0;
      UnderscoresToCamelCase_abi_cxx11_(&local_90,pcVar5,input_00,false,(bool)in_R9B);
      text_03._M_str = "hash ^= (int) $name$Case_;\n";
      text_03._M_len = 0x1b;
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,text_03,(char (*) [5])0x10f3c63,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
      pDVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x38;
    } while (lVar7 < pDVar3->real_oneof_decl_count_);
  }
  if (this->has_extension_ranges_ != false) {
    text_04._M_str = "if (_extensions != null) {\n  hash ^= _extensions.GetHashCode();\n}\n";
    text_04._M_len = 0x42;
    io::Printer::Print<>(printer,text_04);
  }
  text_05._M_str =
       "if (_unknownFields != null) {\n  hash ^= _unknownFields.GetHashCode();\n}\nreturn hash;\n";
  text_05._M_len = 0x55;
  io::Printer::Print<>(printer,text_05);
  io::Printer::Outdent(printer);
  text_06._M_str = "}\n\n";
  text_06._M_len = 3;
  io::Printer::Print<>(printer,text_06);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_07._M_str =
       "public override string ToString() {\n  return pb::JsonFormatter.ToDiagnosticString(this);\n}\n\n"
  ;
  text_07._M_len = 0x5c;
  io::Printer::Print<>(printer,text_07);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_58);
  return;
}

Assistant:

void MessageGenerator::GenerateFrameworkMethods(io::Printer* printer) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["class_name"] = class_name();

  // Equality
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public override bool Equals(object other) {\n"
                 "  return Equals(other as $class_name$);\n"
                 "}\n\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public bool Equals($class_name$ other) {\n"
                 "  if (ReferenceEquals(other, null)) {\n"
                 "    return false;\n"
                 "  }\n"
                 "  if (ReferenceEquals(other, this)) {\n"
                 "    return true;\n"
                 "  }\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->WriteEquals(printer);
  }
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    printer->Print(
        "if ($property_name$Case != other.$property_name$Case) return false;\n",
        "property_name",
        UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true));
  }
  if (has_extension_ranges_) {
    printer->Print(
        "if (!Equals(_extensions, other._extensions)) {\n"
        "  return false;\n"
        "}\n");
  }
  printer->Outdent();
  printer->Print(
      "  return Equals(_unknownFields, other._unknownFields);\n"
      "}\n\n");

  // GetHashCode
  // Start with a non-zero value to easily distinguish between null and "empty"
  // messages.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public override int GetHashCode() {\n"
      "  int hash = 1;\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->WriteHash(printer);
  }
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    printer->Print(
        "hash ^= (int) $name$Case_;\n", "name",
        UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false));
  }
  if (has_extension_ranges_) {
    printer->Print(
        "if (_extensions != null) {\n"
        "  hash ^= _extensions.GetHashCode();\n"
        "}\n");
  }
  printer->Print(
      "if (_unknownFields != null) {\n"
      "  hash ^= _unknownFields.GetHashCode();\n"
      "}\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print("}\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public override string ToString() {\n"
      "  return pb::JsonFormatter.ToDiagnosticString(this);\n"
      "}\n\n");
}